

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall
SQCompilation::NodeEqualChecker::cmpSwitch
          (NodeEqualChecker *this,SwitchStatement *l,SwitchStatement *r)

{
  SwitchCase *pSVar1;
  SwitchCase *pSVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  bVar3 = check(this,&l->_expr->super_Node,&r->_expr->super_Node);
  if ((bVar3) && ((l->_cases)._size == (r->_cases)._size)) {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 8;
    do {
      uVar4 = uVar4 + 1;
      if ((l->_cases)._size <= uVar4) {
        bVar3 = check(this,&((l->_defaultCase).stmt)->super_Node,
                      &((r->_defaultCase).stmt)->super_Node);
        return bVar3;
      }
      pSVar1 = (l->_cases)._vals;
      pSVar2 = (r->_cases)._vals;
      bVar3 = check(this,*(Node **)((long)pSVar1 + lVar5 + -8),*(Node **)((long)pSVar2 + lVar5 + -8)
                   );
      if (!bVar3) {
        return false;
      }
      bVar3 = check(this,*(Node **)((long)&pSVar1->val + lVar5),
                    *(Node **)((long)&pSVar2->val + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool cmpSwitch(const SwitchStatement *l, const SwitchStatement *r) const {
    if (!check(l->expression(), r->expression()))
      return false;

    const auto &lcases = l->cases();
    const auto &rcases = r->cases();

    if (lcases.size() != rcases.size())
      return false;

    for (int32_t i = 0; i < lcases.size(); ++i) {
      const auto &lc = lcases[i];
      const auto &rc = rcases[i];

      if (!check(lc.val, rc.val))
        return false;

      if (!check(lc.stmt, rc.stmt))
        return false;
    }

    return check(l->defaultCase().stmt, r->defaultCase().stmt);
  }